

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O2

void __thiscall
Assimp::FBX::FBXConverter::ConvertWeights
          (FBXConverter *this,aiMesh *out,Model *model,MeshGeometry *geo,
          aiMatrix4x4 *absolute_transform,aiNode *parent,aiNode *root_node,uint materialIndex,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *outputVertStartIndices)

{
  pointer __first1;
  pointer __last1;
  uint uVar1;
  Skin *pSVar2;
  uint *puVar3;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> _Var4
  ;
  aiBone **__first2;
  uint i;
  ulong uVar5;
  pointer ppCVar6;
  ulong __n;
  uint count;
  vector<unsigned_long,_std::allocator<unsigned_long>_> out_indices;
  vector<unsigned_long,_std::allocator<unsigned_long>_> count_out_indices;
  vector<unsigned_long,_std::allocator<unsigned_long>_> index_out_indices;
  vector<aiBone_*,_std::allocator<aiBone_*>_> bones;
  size_t no_index_sentinel;
  aiNode *in_stack_fffffffffffffed0;
  aiNode *in_stack_fffffffffffffed8;
  unsigned_long local_118;
  uint local_10c;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_108;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_e8;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_c8;
  _Vector_base<aiBone_*,_std::allocator<aiBone_*>_> local_a8;
  aiMesh *local_88;
  FBXConverter *local_80;
  Cluster *local_78;
  aiMatrix4x4 *local_70;
  pointer local_68;
  pointer local_60;
  uint *local_58;
  uint *local_50;
  ulong local_48;
  MatIndexArray *local_40;
  value_type_conflict7 local_38;
  
  local_80 = this;
  local_70 = absolute_transform;
  pSVar2 = Geometry::DeformerSkin(&geo->super_Geometry);
  if (pSVar2 == (Skin *)0x0) {
    __assert_fail("geo.DeformerSkin()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/FBX/FBXConverter.cpp"
                  ,0x5d3,
                  "void Assimp::FBX::FBXConverter::ConvertWeights(aiMesh *, const Model &, const MeshGeometry &, const aiMatrix4x4 &, aiNode *, aiNode *, unsigned int, std::vector<unsigned int> *)"
                 );
  }
  local_108._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_108._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_108._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pSVar2 = Geometry::DeformerSkin(&geo->super_Geometry);
  local_a8._M_impl.super__Vector_impl_data._M_start = (aiBone **)0x0;
  local_a8._M_impl.super__Vector_impl_data._M_finish = (aiBone **)0x0;
  local_a8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88 = out;
  if (outputVertStartIndices == (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0 &&
      materialIndex != 0xffffffff) {
    __assert_fail("no_mat_check || outputVertStartIndices",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/FBX/FBXConverter.cpp"
                  ,0x5de,
                  "void Assimp::FBX::FBXConverter::ConvertWeights(aiMesh *, const Model &, const MeshGeometry &, const aiMatrix4x4 &, aiNode *, aiNode *, unsigned int, std::vector<unsigned int> *)"
                 );
  }
  ppCVar6 = (pSVar2->clusters).
            super__Vector_base<const_Assimp::FBX::Cluster_*,_std::allocator<const_Assimp::FBX::Cluster_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_68 = (pSVar2->clusters).
             super__Vector_base<const_Assimp::FBX::Cluster_*,_std::allocator<const_Assimp::FBX::Cluster_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  local_48 = (ulong)materialIndex;
  do {
    if (ppCVar6 == local_68) {
      std::
      _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiBone_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiBone_*>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiBone_*>_>_>
      ::clear(&(local_80->bone_map)._M_t);
      __last1 = local_a8._M_impl.super__Vector_impl_data._M_finish;
      __first1 = local_a8._M_impl.super__Vector_impl_data._M_start;
      if (local_a8._M_impl.super__Vector_impl_data._M_start ==
          local_a8._M_impl.super__Vector_impl_data._M_finish) {
        local_88->mBones = (aiBone **)0x0;
        local_88->mNumBones = 0;
      }
      else {
        uVar5 = (long)local_a8._M_impl.super__Vector_impl_data._M_finish -
                (long)local_a8._M_impl.super__Vector_impl_data._M_start >> 3;
        __n = -(ulong)(uVar5 >> 0x3d != 0) |
              (long)local_a8._M_impl.super__Vector_impl_data._M_finish -
              (long)local_a8._M_impl.super__Vector_impl_data._M_start;
        __first2 = (aiBone **)operator_new__(__n);
        memset(__first2,0,__n);
        local_88->mBones = __first2;
        local_88->mNumBones = (uint)uVar5;
        std::
        swap_ranges<__gnu_cxx::__normal_iterator<aiBone**,std::vector<aiBone*,std::allocator<aiBone*>>>,aiBone**>
                  ((__normal_iterator<aiBone_**,_std::vector<aiBone_*,_std::allocator<aiBone_*>_>_>)
                   __first1,(__normal_iterator<aiBone_**,_std::vector<aiBone_*,_std::allocator<aiBone_*>_>_>
                             )__last1,__first2);
      }
      std::_Vector_base<aiBone_*,_std::allocator<aiBone_*>_>::~_Vector_base(&local_a8);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_e8);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_c8);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_108);
      return;
    }
    local_78 = *ppCVar6;
    if (local_78 == (Cluster *)0x0) {
      __assert_fail("cluster",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/FBX/FBXConverter.cpp"
                    ,0x5e3,
                    "void Assimp::FBX::FBXConverter::ConvertWeights(aiMesh *, const Model &, const MeshGeometry &, const aiMatrix4x4 &, aiNode *, aiNode *, unsigned int, std::vector<unsigned int> *)"
                   );
    }
    local_40 = MeshGeometry::GetMaterialIndices(geo);
    local_38 = 0xffffffffffffffff;
    if (local_e8._M_impl.super__Vector_impl_data._M_finish !=
        local_e8._M_impl.super__Vector_impl_data._M_start) {
      local_e8._M_impl.super__Vector_impl_data._M_finish =
           local_e8._M_impl.super__Vector_impl_data._M_start;
    }
    if (local_c8._M_impl.super__Vector_impl_data._M_finish !=
        local_c8._M_impl.super__Vector_impl_data._M_start) {
      local_c8._M_impl.super__Vector_impl_data._M_finish =
           local_c8._M_impl.super__Vector_impl_data._M_start;
    }
    if (local_108._M_impl.super__Vector_impl_data._M_finish !=
        local_108._M_impl.super__Vector_impl_data._M_start) {
      local_108._M_impl.super__Vector_impl_data._M_finish =
           local_108._M_impl.super__Vector_impl_data._M_start;
    }
    local_58 = (local_78->indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    puVar3 = (local_78->indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    local_60 = ppCVar6;
    while (ppCVar6 = local_60, puVar3 != local_58) {
      local_10c = 0;
      local_50 = puVar3;
      puVar3 = MeshGeometry::ToOutputVertexIndex(geo,*puVar3,&local_10c);
      if (puVar3 == (uint *)0x0) {
        __assert_fail("out_idx != nullptr",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/FBX/FBXConverter.cpp"
                      ,0x5f8,
                      "void Assimp::FBX::FBXConverter::ConvertWeights(aiMesh *, const Model &, const MeshGeometry &, const aiMatrix4x4 &, aiNode *, aiNode *, unsigned int, std::vector<unsigned int> *)"
                     );
      }
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_c8,&local_38);
      local_118 = 0;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_e8,&local_118);
      for (uVar5 = 0; uVar5 < local_10c; uVar5 = uVar5 + 1) {
        if (materialIndex == 0xffffffff) {
LAB_005188a3:
          if (local_c8._M_impl.super__Vector_impl_data._M_finish[-1] == 0xffffffffffffffff) {
            local_c8._M_impl.super__Vector_impl_data._M_finish[-1] =
                 (long)local_108._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_108._M_impl.super__Vector_impl_data._M_start >> 3;
          }
          if (materialIndex == 0xffffffff) {
            local_118 = (unsigned_long)*puVar3;
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_108,
                       &local_118);
          }
          else {
            _Var4 = std::
                    __lower_bound<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,unsigned_int,__gnu_cxx::__ops::_Iter_less_val>
                              ((outputVertStartIndices->
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                               _M_impl.super__Vector_impl_data._M_start,
                               (outputVertStartIndices->
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                               _M_impl.super__Vector_impl_data._M_finish,puVar3);
            local_118 = (long)_Var4._M_current -
                        (long)(outputVertStartIndices->
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                              _M_impl.super__Vector_impl_data._M_start >> 2;
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_108,
                       &local_118);
          }
          local_e8._M_impl.super__Vector_impl_data._M_finish[-1] =
               local_e8._M_impl.super__Vector_impl_data._M_finish[-1] + 1;
        }
        else {
          uVar1 = MeshGeometry::FaceForVertexIndex(geo,*puVar3);
          if ((long)(local_40->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start[uVar1] == local_48) goto LAB_005188a3;
        }
        puVar3 = puVar3 + 1;
      }
      puVar3 = local_50 + 1;
    }
    ConvertCluster(local_80,(vector<aiBone_*,_std::allocator<aiBone_*>_> *)&local_a8,local_78,
                   (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_108,
                   (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_c8,
                   (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_e8,local_70,
                   in_stack_fffffffffffffed0,in_stack_fffffffffffffed8);
    ppCVar6 = ppCVar6 + 1;
  } while( true );
}

Assistant:

void FBXConverter::ConvertWeights(aiMesh *out, const Model &model, const MeshGeometry &geo,
                                          const aiMatrix4x4 &absolute_transform,
                                          aiNode *parent, aiNode *root_node, unsigned int materialIndex,
                                          std::vector<unsigned int> *outputVertStartIndices)
        {
            ai_assert(geo.DeformerSkin());

            std::vector<size_t> out_indices;
            std::vector<size_t> index_out_indices;
            std::vector<size_t> count_out_indices;

            const Skin& sk = *geo.DeformerSkin();

            std::vector<aiBone*> bones;

            const bool no_mat_check = materialIndex == NO_MATERIAL_SEPARATION;
            ai_assert(no_mat_check || outputVertStartIndices);

            try {
                // iterate over the sub deformers
                for (const Cluster* cluster : sk.Clusters()) {
                    ai_assert(cluster);

                    const WeightIndexArray& indices = cluster->GetIndices();

                    const MatIndexArray& mats = geo.GetMaterialIndices();

                    const size_t no_index_sentinel = std::numeric_limits<size_t>::max();

                    count_out_indices.clear();
                    index_out_indices.clear();
                    out_indices.clear();


                    // now check if *any* of these weights is contained in the output mesh,
                    // taking notes so we don't need to do it twice.
                    for (WeightIndexArray::value_type index : indices) {

                        unsigned int count = 0;
                        const unsigned int* const out_idx = geo.ToOutputVertexIndex(index, count);
                        // ToOutputVertexIndex only returns nullptr if index is out of bounds
                        // which should never happen
                        ai_assert(out_idx != nullptr);

                        index_out_indices.push_back(no_index_sentinel);
                        count_out_indices.push_back(0);

                        for (unsigned int i = 0; i < count; ++i) {
                            if (no_mat_check || static_cast<size_t>(mats[geo.FaceForVertexIndex(out_idx[i])]) == materialIndex) {

                                if (index_out_indices.back() == no_index_sentinel) {
                                    index_out_indices.back() = out_indices.size();
                                }

                                if (no_mat_check) {
                                    out_indices.push_back(out_idx[i]);
                                } else {
                                    // this extra lookup is in O(logn), so the entire algorithm becomes O(nlogn)
                                    const std::vector<unsigned int>::iterator it = std::lower_bound(
                                        outputVertStartIndices->begin(),
                                        outputVertStartIndices->end(),
                                        out_idx[i]
                                    );

                                    out_indices.push_back(std::distance(outputVertStartIndices->begin(), it));
                                }

                                ++count_out_indices.back();                               
                            }
                        }
                    }

                    // if we found at least one, generate the output bones
                    // XXX this could be heavily simplified by collecting the bone
                    // data in a single step.
                    ConvertCluster(bones, cluster, out_indices, index_out_indices,
                                   count_out_indices, absolute_transform, parent, root_node);
                }

                bone_map.clear();
            }
            catch (std::exception&e) {
                std::for_each(bones.begin(), bones.end(), Util::delete_fun<aiBone>());
                throw;
            }

            if (bones.empty()) {
                out->mBones = nullptr;
                out->mNumBones = 0;
                return;
            } else {
                out->mBones = new aiBone *[bones.size()]();
                out->mNumBones = static_cast<unsigned int>(bones.size());

                std::swap_ranges(bones.begin(), bones.end(), out->mBones);
            }
        }